

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O2

void __thiscall
booster::locale::util::gregorian_calendar::adjust_value
          (gregorian_calendar *this,period_mark p,update_type u,int difference)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  if (u == roll) {
    iVar2 = (*(this->super_abstract_calendar)._vptr_abstract_calendar[3])(this,(ulong)p,1);
    iVar3 = (*(this->super_abstract_calendar)._vptr_abstract_calendar[3])(this,(ulong)p,5);
    if (iVar3 - iVar2 < 0) {
      return;
    }
    uVar5 = (iVar3 - iVar2) + 1;
    iVar3 = (*(this->super_abstract_calendar)._vptr_abstract_calendar[3])(this,(ulong)p,3);
    iVar4 = 0;
    if (difference < 0) {
      iVar4 = ((uint)-difference / uVar5 + 1) * uVar5;
    }
    (*(this->super_abstract_calendar)._vptr_abstract_calendar[1])
              (this,(ulong)p,
               (ulong)(uint)((iVar3 + iVar4 + (difference - iVar2)) % (int)uVar5 + iVar2));
  }
  else {
    if (u != move) {
      return;
    }
    switch(p) {
    case year:
    case extended_year:
      piVar1 = &(this->tm_updated_).tm_year;
      *piVar1 = *piVar1 + difference;
      break;
    case month:
      piVar1 = &(this->tm_updated_).tm_mon;
      *piVar1 = *piVar1 + difference;
      break;
    case day:
    case day_of_year:
    case day_of_week:
    case day_of_week_local:
      piVar1 = &(this->tm_updated_).tm_mday;
      *piVar1 = *piVar1 + difference;
      break;
    case day_of_week_in_month:
    case week_of_year:
    case week_of_month:
      piVar1 = &(this->tm_updated_).tm_mday;
      *piVar1 = *piVar1 + difference * 7;
      break;
    case hour:
    case hour_12:
      piVar1 = &(this->tm_updated_).tm_hour;
      *piVar1 = *piVar1 + difference;
      break;
    case am_pm:
      piVar1 = &(this->tm_updated_).tm_hour;
      *piVar1 = *piVar1 + difference * 0xc;
      break;
    case minute:
      piVar1 = &(this->tm_updated_).tm_min;
      *piVar1 = *piVar1 + difference;
      break;
    case second:
      (this->tm_updated_).tm_sec = (this->tm_updated_).tm_sec + difference;
    }
    this->normalized_ = false;
  }
  (*(this->super_abstract_calendar)._vptr_abstract_calendar[2])(this);
  return;
}

Assistant:

virtual void adjust_value(period::marks::period_mark p,update_type u,int difference)
            {
                switch(u) {
                case move:
                    {
                        using namespace period::marks;
                        switch(p) {
                        case year:                       ///< Year, it is calendar specific
                        case extended_year:              ///< Extended year for Gregorian/Julian calendars, where 1 BC == 0, 2 BC == -1.
                            tm_updated_.tm_year +=difference;
                            break;
                        case month:
                            tm_updated_.tm_mon +=difference;
                            break;
                        case day:
                        case day_of_year:
                        case day_of_week:                ///< Day of week, starting from Sunday, [1..7]
                        case day_of_week_local: ///< Local day of week, for example in France Monday is 1, in US Sunday is 1, [1..7]
                            tm_updated_.tm_mday +=difference;
                            break;
                        case hour:                       ///< 24 clock hour [0..23]
                        case hour_12:                    ///< 12 clock hour [0..11]
                            tm_updated_.tm_hour += difference;
                            break;
                        case am_pm:                      ///< am or pm marker, [0..1]
                            tm_updated_.tm_hour += 12 * difference;
                            break;
                        case minute:                     ///< minute [0..59]
                            tm_updated_.tm_min += difference;
                            break;
                        case second:
                            tm_updated_.tm_sec += difference;
                            break;
                        case week_of_year:               ///< The week number in the year
                        case week_of_month:              ///< The week number withing current month
                        case day_of_week_in_month:       ///< Original number of the day of the week in month.
                            tm_updated_.tm_mday +=difference * 7;
                            break;
                        default:
                            ; // Not all values are adjustable
                        }
                        normalized_ = false;
                        normalize();
                    }
                    break;
                case roll:
                    { // roll
                        int cur_min = get_value(p,actual_minimum);
                        int cur_max = get_value(p,actual_maximum);
                        int max_diff = cur_max - cur_min + 1;
                        if(max_diff > 0) {
                            int value = get_value(p,current);
                            int addon = 0;
                            if(difference < 0)
                                addon = ((-difference/max_diff) + 1) * max_diff;
                            value = (value - cur_min + difference + addon) % max_diff + cur_min;
                            set_value(p,value);
                            normalize();
                        }
                    }
                default:
                    ;
                }
            }